

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTargetCollectLinkLanguages::Visit(cmTargetCollectLinkLanguages *this,cmLinkItem *item)

{
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *this_00;
  PolicyStatus PVar1;
  LinkInterface *pLVar2;
  long lVar3;
  ostream *poVar4;
  cmake *this_01;
  PolicyID id;
  MessageType t;
  pointer __obj;
  pointer item_00;
  pair<std::_Rb_tree_iterator<const_cmTarget_*>,_bool> pVar5;
  ostringstream e;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  if (item->Target == (cmTarget *)0x0) {
    lVar3 = std::__cxx11::string::find((char *)item,0x4b3c42,0);
    if (lVar3 != -1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      PVar1 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0028);
      if (PVar1 != OLD) {
        t = FATAL_ERROR;
        if (PVar1 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x1c,id);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                              local_1c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          t = AUTHOR_WARNING;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(this->Target->Name)._M_dataplus._M_p,
                            (this->Target->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" links to target \"",0x13);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(item->super_string)._M_dataplus._M_p,
                            (item->super_string)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,
                   "\" but the target was not found.  Perhaps a find_package() call is missing for an IMPORTED target, or an ALIAS target is missing?"
                   ,0x80);
        this_01 = cmMakefile::GetCMakeInstance(this->Makefile);
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(this_01,t,&local_1c8,&((this->Target->Internal).Pointer)->Backtrace);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    }
  }
  else {
    pVar5 = std::
            _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
            ::_M_insert_unique<cmTarget_const*const&>
                      ((_Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
                        *)&this->Visited,&item->Target);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pLVar2 = cmTarget::GetLinkInterface(item->Target,&this->Config,this->HeadTarget);
      if (pLVar2 != (LinkInterface *)0x0) {
        __obj = (pLVar2->Languages).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        if (__obj != (pLVar2->Languages).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            this_00 = &this->Languages->_M_ht;
            cmsys::
            hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
            ::resize(this_00,this_00->_M_num_elements + 1);
            cmsys::
            hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
            ::insert_unique_noresize
                      ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                        *)local_1a8,this_00,__obj);
            __obj = __obj + 1;
          } while (__obj != (pLVar2->Languages).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
        }
        for (item_00 = (pLVar2->super_LinkInterfaceLibraries).Libraries.
                       super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                       super__Vector_impl_data._M_start;
            item_00 !=
            (pLVar2->super_LinkInterfaceLibraries).Libraries.
            super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
            super__Vector_impl_data._M_finish; item_00 = item_00 + 1) {
          Visit(this,item_00);
        }
      }
    }
  }
  return;
}

Assistant:

void Visit(cmLinkItem const& item)
    {
    if(!item.Target)
      {
      if(item.find("::") != std::string::npos)
        {
        bool noMessage = false;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        std::ostringstream e;
        switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0028))
          {
          case cmPolicies::WARN:
            {
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0028) << "\n";
            messageType = cmake::AUTHOR_WARNING;
            }
            break;
          case cmPolicies::OLD:
            noMessage = true;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            // Issue the fatal message.
            break;
          }

        if(!noMessage)
          {
          e << "Target \"" << this->Target->GetName()
            << "\" links to target \"" << item
            << "\" but the target was not found.  Perhaps a find_package() "
            "call is missing for an IMPORTED target, or an ALIAS target is "
            "missing?";
          this->Makefile->GetCMakeInstance()->IssueMessage(messageType,
                                                e.str(),
                                                this->Target->GetBacktrace());
          }
        }
      return;
      }
    if(!this->Visited.insert(item.Target).second)
      {
      return;
      }

    cmTarget::LinkInterface const* iface =
      item.Target->GetLinkInterface(this->Config, this->HeadTarget);
    if(!iface) { return; }

    for(std::vector<std::string>::const_iterator
          li = iface->Languages.begin(); li != iface->Languages.end(); ++li)
      {
      this->Languages.insert(*li);
      }

    for(std::vector<cmLinkItem>::const_iterator
          li = iface->Libraries.begin(); li != iface->Libraries.end(); ++li)
      {
      this->Visit(*li);
      }
    }